

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

int av1_cdef_compute_sb_list
              (CommonModeInfoParams *mi_params,int mi_row,int mi_col,cdef_list *dlist,BLOCK_SIZE bs)

{
  MB_MODE_INFO **grid_00;
  int iVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char in_R8B;
  int c;
  int r;
  int count;
  int c_shift;
  int r_shift;
  int c_step;
  int r_step;
  int maxr;
  int maxc;
  MB_MODE_INFO **grid;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_30;
  undefined4 local_2c;
  
  grid_00 = *(MB_MODE_INFO ***)(in_RDI + 0x30);
  local_54 = *(int *)(in_RDI + 0x10) - in_EDX;
  local_5c = *(int *)(in_RDI + 0xc) - in_ESI;
  if ((in_R8B == '\x0f') || (in_R8B == '\x0e')) {
    local_50 = local_54;
    if (0x1f < local_54) {
      local_50 = 0x20;
    }
    local_2c = local_50;
  }
  else {
    if (0xf < local_54) {
      local_54 = 0x10;
    }
    local_2c = local_54;
  }
  if ((in_R8B == '\x0f') || (in_R8B == '\r')) {
    local_58 = local_5c;
    if (0x1f < local_5c) {
      local_58 = 0x20;
    }
    local_30 = local_58;
  }
  else {
    if (0xf < local_5c) {
      local_5c = 0x10;
    }
    local_30 = local_5c;
  }
  local_44 = 0;
  for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 2) {
    for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 2) {
      iVar1 = is_8x8_block_skip(grid_00,in_ESI + local_48,in_EDX + local_4c,*(int *)(in_RDI + 0x3c))
      ;
      if (iVar1 == 0) {
        *(char *)(in_RCX + (long)local_44 * 2) = (char)(local_48 >> 1);
        *(char *)(in_RCX + 1 + (long)local_44 * 2) = (char)(local_4c >> 1);
        local_44 = local_44 + 1;
      }
    }
  }
  return local_44;
}

Assistant:

int av1_cdef_compute_sb_list(const CommonModeInfoParams *const mi_params,
                             int mi_row, int mi_col, cdef_list *dlist,
                             BLOCK_SIZE bs) {
  MB_MODE_INFO **grid = mi_params->mi_grid_base;
  int maxc = mi_params->mi_cols - mi_col;
  int maxr = mi_params->mi_rows - mi_row;

  if (bs == BLOCK_128X128 || bs == BLOCK_128X64)
    maxc = AOMMIN(maxc, MI_SIZE_128X128);
  else
    maxc = AOMMIN(maxc, MI_SIZE_64X64);
  if (bs == BLOCK_128X128 || bs == BLOCK_64X128)
    maxr = AOMMIN(maxr, MI_SIZE_128X128);
  else
    maxr = AOMMIN(maxr, MI_SIZE_64X64);

  const int r_step = 2;  // mi_size_high[BLOCK_8X8]
  const int c_step = 2;  // mi_size_wide[BLOCK_8X8]
  const int r_shift = 1;
  const int c_shift = 1;
  int count = 0;
  for (int r = 0; r < maxr; r += r_step) {
    for (int c = 0; c < maxc; c += c_step) {
      if (!is_8x8_block_skip(grid, mi_row + r, mi_col + c,
                             mi_params->mi_stride)) {
        dlist[count].by = r >> r_shift;
        dlist[count].bx = c >> c_shift;
        count++;
      }
    }
  }
  return count;
}